

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::GetDirFromEnv_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,
          initializer_list<const_char_*> environment_variables,char *fallback,char separator)

{
  char *__s;
  size_t sVar1;
  string *psVar2;
  long lVar3;
  allocator<char> local_51;
  allocator<char> local_50 [32];
  
  lVar3 = 0;
  do {
    __s = (char *)environment_variables._M_len;
    if ((long)environment_variables._M_array << 3 == lVar3) {
LAB_0011e973:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,local_50);
      return __return_storage_ptr__;
    }
    __s = getenv(*(char **)(this + lVar3));
    if ((__s != (char *)0x0) && (*__s != '\0')) {
      sVar1 = strlen(__s);
      if (__s[sVar1 - 1] != '/') {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_51);
        psVar2 = (string *)std::__cxx11::string::append((ulong)local_50,'\x01');
        std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
        std::__cxx11::string::~string((string *)local_50);
        return __return_storage_ptr__;
      }
      goto LAB_0011e973;
    }
    lVar3 = lVar3 + 8;
  } while( true );
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}